

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance
          (CopiesAndBlittingTestInstance *this,Context *context,TestParams *testParams)

{
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data_01;
  VkDevice device;
  VkDevice vk_00;
  Handle<(vk::HandleType)24> *pHVar1;
  Move<vk::Handle<(vk::HandleType)6>_> local_110;
  RefData<vk::Handle<(vk::HandleType)6>_> local_f0;
  deUint64 local_d0;
  Move<vk::VkCommandBuffer_s_*> local_c8;
  RefData<vk::VkCommandBuffer_s_*> local_a8;
  Move<vk::Handle<(vk::HandleType)24>_> local_88;
  RefData<vk::Handle<(vk::HandleType)24>_> local_68;
  deUint32 local_44;
  VkDevice pVStack_40;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  TestParams *local_20;
  TestParams *testParams_local;
  Context *context_local;
  CopiesAndBlittingTestInstance *this_local;
  
  local_20 = testParams;
  testParams_local = (TestParams *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__CopiesAndBlittingTestInstance_016a1c30;
  TestParams::TestParams(&this->m_params,testParams);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(&this->m_fence);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            (&this->m_sourceTextureLevel);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            (&this->m_destinationTextureLevel);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            (&this->m_expectedTextureLevel);
  vkDevice = (VkDevice)Context::getDeviceInterface((Context *)testParams_local);
  pVStack_40 = Context::getDevice((Context *)testParams_local);
  local_44 = Context::getUniversalQueueFamilyIndex((Context *)testParams_local);
  ::vk::createCommandPool
            (&local_88,(DeviceInterface *)vkDevice,pVStack_40,2,local_44,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
  data.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
  data.object.m_internal = local_68.object.m_internal;
  data.deleter.m_device = local_68.deleter.m_device;
  data.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_88);
  vk_00 = vkDevice;
  device = pVStack_40;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  local_d0 = pHVar1->m_internal;
  ::vk::allocateCommandBuffer
            (&local_c8,(DeviceInterface *)vk_00,device,(VkCommandPool)local_d0,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data_00.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data_00.object = local_a8.object;
  data_00.deleter.m_device = local_a8.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_a8.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_c8);
  ::vk::createFence(&local_110,(DeviceInterface *)vkDevice,pVStack_40,0,(VkAllocationCallbacks *)0x0
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f0,(Move *)&local_110);
  data_01.deleter.m_deviceIface = local_f0.deleter.m_deviceIface;
  data_01.object.m_internal = local_f0.object.m_internal;
  data_01.deleter.m_device = local_f0.deleter.m_device;
  data_01.deleter.m_allocator = local_f0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=(&this->m_fence,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_110);
  return;
}

Assistant:

CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance (Context& context, TestParams testParams)
	: vkt::TestInstance	(context)
	, m_params			(testParams)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				vkDevice			= context.getDevice();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	m_fence = createFence(vk, vkDevice);
}